

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O0

void avro::
     codec_traits<std::vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>_>
     ::decode(Decoder *d,
             vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
             *s)

{
  long *in_RDI;
  _union_array_union_Union__0__ t;
  size_t i;
  size_t n;
  _union_array_union_Union__0__ *t_00;
  Decoder *in_stack_ffffffffffffffc0;
  value_type *in_stack_ffffffffffffffc8;
  vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
  *in_stack_ffffffffffffffd0;
  ulong local_20;
  ulong local_18;
  
  std::
  vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>::
  clear((vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
         *)0x2cda58);
  local_18 = (**(code **)(*in_RDI + 0x80))();
  while (local_18 != 0) {
    for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
      t_00 = (_union_array_union_Union__0__ *)&stack0xffffffffffffffd0;
      uau::_union_array_union_Union__0__::_union_array_union_Union__0__
                ((_union_array_union_Union__0__ *)0x2cda9a);
      decode<uau::_union_array_union_Union__0__>(in_stack_ffffffffffffffc0,t_00);
      std::
      vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
      ::push_back(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      uau::_union_array_union_Union__0__::~_union_array_union_Union__0__
                ((_union_array_union_Union__0__ *)0x2cdac5);
    }
    local_18 = (**(code **)(*in_RDI + 0x88))();
  }
  return;
}

Assistant:

static void decode(Decoder& d, std::vector<T>& s) {
        s.clear();
        for (size_t n = d.arrayStart(); n != 0; n = d.arrayNext()) {
            for (size_t i = 0; i < n; ++i) {
                T t;
                avro::decode(d, t);
                s.push_back(t);
            }
        }
    }